

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate.c
# Opt level: O2

uLong deflateBound(z_streamp strm,uLong sourceLen)

{
  Bytef BVar1;
  uint uVar2;
  internal_state *piVar3;
  gz_headerp pgVar4;
  int iVar5;
  Bytef *pBVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  uLong uVar10;
  ulong uStack_30;
  
  uVar7 = (sourceLen >> 9) + (sourceLen >> 3) + sourceLen + (sourceLen >> 8) + 4;
  uVar9 = sourceLen + (sourceLen >> 5) + 7 + (sourceLen >> 0xb) + (sourceLen >> 7);
  iVar5 = deflateStateCheck(strm);
  if (iVar5 == 0) {
    piVar3 = strm->state;
    uVar2 = piVar3->wrap;
    uStack_30 = (ulong)uVar2;
    if ((ulong)uVar2 != 0) {
      if (uVar2 == 2) {
        pgVar4 = piVar3->gzhead;
        if (pgVar4 == (gz_headerp)0x0) {
          uStack_30 = 0x12;
        }
        else {
          if (pgVar4->extra == (Bytef *)0x0) {
            uVar8 = 0x12;
          }
          else {
            uVar8 = (ulong)(pgVar4->extra_len + 2) + 0x12;
          }
          pBVar6 = pgVar4->name;
          if (pBVar6 != (Bytef *)0x0) {
            do {
              uVar8 = uVar8 + 1;
              BVar1 = *pBVar6;
              pBVar6 = pBVar6 + 1;
            } while (BVar1 != '\0');
          }
          pBVar6 = pgVar4->comment;
          if (pBVar6 != (Bytef *)0x0) {
            do {
              uVar8 = uVar8 + 1;
              BVar1 = *pBVar6;
              pBVar6 = pBVar6 + 1;
            } while (BVar1 != '\0');
          }
          uStack_30 = uVar8 + 2;
          if (pgVar4->hcrc == 0) {
            uStack_30 = uVar8;
          }
        }
      }
      else if (uVar2 == 1) {
        uStack_30 = (ulong)(piVar3->strstart != 0) * 4 + 6;
      }
      else {
        uStack_30 = 6;
      }
    }
    if (piVar3->chromium_zlib_hash == 0) {
      if (piVar3->hash_bits == 0xf && piVar3->w_bits == 0xf) {
        uVar10 = (sourceLen >> 0x19) + (sourceLen >> 0xe) + (sourceLen >> 0xc) + sourceLen + 7 +
                 uStack_30;
      }
      else {
        if ((piVar3->hash_bits < piVar3->w_bits) || (piVar3->level == 0)) {
          uVar7 = uVar9;
        }
        uVar10 = uVar7 + uStack_30;
      }
    }
    else {
      if (uVar9 < uVar7) {
        uVar9 = uVar7;
      }
      uVar10 = uStack_30 + uVar9;
    }
  }
  else {
    if (uVar9 < uVar7) {
      uVar9 = uVar7;
    }
    uVar10 = uVar9 + 6;
  }
  return uVar10;
}

Assistant:

uLong ZEXPORT deflateBound(z_streamp strm, uLong sourceLen) {
    deflate_state *s;
    uLong fixedlen, storelen, wraplen;

    /* upper bound for fixed blocks with 9-bit literals and length 255
       (memLevel == 2, which is the lowest that may not use stored blocks) --
       ~13% overhead plus a small constant */
    fixedlen = sourceLen + (sourceLen >> 3) + (sourceLen >> 8) +
               (sourceLen >> 9) + 4;

    /* upper bound for stored blocks with length 127 (memLevel == 1) --
       ~4% overhead plus a small constant */
    storelen = sourceLen + (sourceLen >> 5) + (sourceLen >> 7) +
               (sourceLen >> 11) + 7;

    /* if can't get parameters, return larger bound plus a zlib wrapper */
    if (deflateStateCheck(strm))
        return (fixedlen > storelen ? fixedlen : storelen) + 6;

    /* compute wrapper length */
    s = strm->state;
    switch (s->wrap) {
    case 0:                                 /* raw deflate */
        wraplen = 0;
        break;
    case 1:                                 /* zlib wrapper */
        wraplen = 6 + (s->strstart ? 4 : 0);
        break;
#ifdef GZIP
    case 2:                                 /* gzip wrapper */
        wraplen = 18;
        if (s->gzhead != Z_NULL) {          /* user-supplied gzip header */
            Bytef *str;
            if (s->gzhead->extra != Z_NULL)
                wraplen += 2 + s->gzhead->extra_len;
            str = s->gzhead->name;
            if (str != Z_NULL)
                do {
                    wraplen++;
                } while (*str++);
            str = s->gzhead->comment;
            if (str != Z_NULL)
                do {
                    wraplen++;
                } while (*str++);
            if (s->gzhead->hcrc)
                wraplen += 2;
        }
        break;
#endif
    default:                                /* for compiler happiness */
        wraplen = 6;
    }

    /* With Chromium's hashing, s->hash_bits may not correspond to the
       memLevel, making the computations below incorrect. Return the
       conservative bound. */
    if (s->chromium_zlib_hash)
        return (fixedlen > storelen ? fixedlen : storelen) + wraplen;

    /* if not default parameters, return one of the conservative bounds */
    if (s->w_bits != 15 || s->hash_bits != 8 + 7)
        return (s->w_bits <= s->hash_bits && s->level ? fixedlen : storelen) +
               wraplen;

    /* default settings: return tight bound for that case -- ~0.03% overhead
       plus a small constant */
    return sourceLen + (sourceLen >> 12) + (sourceLen >> 14) +
           (sourceLen >> 25) + 13 - 6 + wraplen;
}